

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

SliceLayerParams * __thiscall
CoreML::Specification::SliceLayerParams::New(SliceLayerParams *this,Arena *arena)

{
  SliceLayerParams *this_00;
  
  this_00 = (SliceLayerParams *)operator_new(0x30);
  SliceLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SliceLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

SliceLayerParams* SliceLayerParams::New(::google::protobuf::Arena* arena) const {
  SliceLayerParams* n = new SliceLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}